

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall File::readBool(File *this,bool *value)

{
  size_t sVar1;
  uchar boolValue;
  char local_9;
  
  if (this->valid == true) {
    sVar1 = fread(&local_9,1,1,(FILE *)this->stream);
    if (sVar1 == 1) {
      *value = local_9 != '\0';
    }
    return sVar1 == 1;
  }
  return false;
}

Assistant:

bool File::readBool(bool& value)
{
	if (!valid) return false;

	// Read the boolean from the file
	unsigned char boolValue;

	if (fread(&boolValue, 1, 1, stream) != 1)
	{
		return false;
	}

	value = boolValue ? true : false;

	return true;
}